

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

TableViewCell * __thiscall
QtMWidgets::TableViewSection::removeCell(TableViewSection *this,int index)

{
  TableViewCell *pTVar1;
  RowsSeparator *pRVar2;
  TableViewSectionPrivate *pTVar3;
  qsizetype qVar4;
  const_reference ppTVar5;
  const_reference ppRVar6;
  RowsSeparator *s;
  TableViewCell *cell;
  int index_local;
  TableViewSection *this_local;
  
  if (-1 < index) {
    pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
             ::operator->(&this->d);
    qVar4 = QList<QtMWidgets::TableViewCell_*>::size(&pTVar3->cells);
    if (index < qVar4) {
      pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
               ::operator->(&this->d);
      ppTVar5 = QList<QtMWidgets::TableViewCell_*>::at(&pTVar3->cells,(long)index);
      pTVar1 = *ppTVar5;
      if (index != 0) {
        pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
                 ::operator->(&this->d);
        ppRVar6 = QList<QtMWidgets::RowsSeparator_*>::at(&pTVar3->separators,(long)(index + -1));
        pRVar2 = *ppRVar6;
        pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
                 ::operator->(&this->d);
        QLayout::removeWidget((QWidget *)pTVar3->layout);
        pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
                 ::operator->(&this->d);
        QList<QtMWidgets::RowsSeparator_*>::removeAt(&pTVar3->separators,(long)(index + -1));
        if (pRVar2 != (RowsSeparator *)0x0) {
          (**(code **)(*(long *)pRVar2 + 0x20))();
        }
      }
      pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
               ::operator->(&this->d);
      QLayout::removeWidget((QWidget *)pTVar3->layout);
      QWidget::setParent(&pTVar1->super_QWidget);
      QWidget::hide();
      pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
               ::operator->(&this->d);
      QList<QtMWidgets::TableViewCell_*>::removeAt(&pTVar3->cells,(long)index);
      QWidget::adjustSize();
      return pTVar1;
    }
  }
  return (TableViewCell *)0x0;
}

Assistant:

TableViewCell *
TableViewSection::removeCell( int index )
{
	if( index >= 0 && index < d->cells.size() )
	{
		TableViewCell * cell = d->cells.at( index );

		if( index != 0 )
		{
			RowsSeparator * s = d->separators.at( index - 1 );
			d->layout->removeWidget( s );
			d->separators.removeAt( index - 1 );
			delete s;
		}

		d->layout->removeWidget( cell );
		cell->setParent( 0 );
		cell->hide();

		d->cells.removeAt( index );

		adjustSize();

		return cell;
	}
	else
		return 0;
}